

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O0

void ptrobj_bang(t_ptrobj *x)

{
  int iVar1;
  t_symbol *ptVar2;
  t_typedout *local_28;
  t_typedout *to;
  int n;
  t_symbol *templatesym;
  t_ptrobj *x_local;
  
  iVar1 = gpointer_check(&x->x_gp,1);
  if (iVar1 == 0) {
    pd_error(x,"pointer bang: empty pointer");
  }
  else {
    ptVar2 = gpointer_gettemplatesym(&x->x_gp);
    local_28 = x->x_typedout;
    to._4_4_ = x->x_ntypedout;
    while (to._4_4_ != 0) {
      if (local_28->to_type == ptVar2) {
        outlet_pointer(local_28->to_outlet,&x->x_gp);
        return;
      }
      local_28 = local_28 + 1;
      to._4_4_ = to._4_4_ + -1;
    }
    outlet_pointer(x->x_otherout,&x->x_gp);
  }
  return;
}

Assistant:

static void ptrobj_bang(t_ptrobj *x)
{
    t_symbol *templatesym;
    int n;
    t_typedout *to;
    if (!gpointer_check(&x->x_gp, 1))
    {
        pd_error(x, "pointer bang: empty pointer");
        return;
    }
    templatesym = gpointer_gettemplatesym(&x->x_gp);
    for (n = x->x_ntypedout, to = x->x_typedout; n--; to++)
    {
        if (to->to_type == templatesym)
        {
            outlet_pointer(to->to_outlet, &x->x_gp);
            return;
        }
    }
    outlet_pointer(x->x_otherout, &x->x_gp);
}